

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.h
# Opt level: O1

Image get_image_from_grid(Grid *grid)

{
  int iVar1;
  uint uVar2;
  GridNode *pGVar3;
  int iVar4;
  Image pCVar5;
  int newY;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_88;
  float fStack_84;
  long local_68;
  
  iVar1 = grid->rows;
  uVar2 = grid->columns;
  iVar4 = iVar1 * uVar2 * 0x3c * 0x3c;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar10 = (long)iVar4 * 4;
  }
  pCVar5 = (Image)operator_new__(uVar10);
  if (0 < (long)iVar1) {
    iVar4 = 0;
    local_68 = 0;
    do {
      if (0 < (int)uVar2) {
        pGVar3 = grid->nodes;
        uVar10 = 0;
        iVar11 = iVar4;
        do {
          fVar12 = 0.0;
          switch(pGVar3[local_68 * (ulong)uVar2 + uVar10].state) {
          case EMPTY:
          case NEIGHBOUR:
            local_88 = 1.0;
            fStack_84 = 1.0;
            fVar12 = 255.0;
            break;
          case ORIGIN:
            fVar12 = 204.0;
          default:
            local_88 = 0.0;
            fStack_84 = 0.0;
            break;
          case TARGET:
            local_88 = 0.8;
            fStack_84 = 0.0;
            break;
          case PATH:
            local_88 = 0.0;
            fStack_84 = 0.65;
            break;
          case CHECKED:
            local_88 = 0.75;
            fStack_84 = 1.0;
          }
          fVar12 = floorf(fVar12);
          fVar13 = floorf(fStack_84 * 255.0);
          fVar14 = floorf(local_88 * 255.0);
          iVar6 = 0;
          iVar7 = iVar11;
          do {
            lVar8 = 0;
            do {
              iVar9 = iVar7 + (int)lVar8;
              if ((iVar6 - 0x3aU < 0xffffffc8) || ((int)lVar8 - 0x3aU < 0xffffffc8)) {
                pCVar5[iVar9] = 0xff262626;
              }
              else {
                pCVar5[iVar9] = (int)fVar14 | (int)fVar12 << 0x10 | (int)fVar13 << 8 | 0xff000000;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x3c);
            iVar6 = iVar6 + 1;
            iVar7 = iVar7 + uVar2 * 0x3c;
          } while (iVar6 != 0x3c);
          uVar10 = uVar10 + 1;
          iVar11 = iVar11 + 0x3c;
        } while (uVar10 != uVar2);
      }
      local_68 = local_68 + 1;
      iVar4 = iVar4 + uVar2 * 0xe10;
    } while (local_68 != iVar1);
  }
  return pCVar5;
}

Assistant:

Image get_image_from_grid(Grid *grid)
{
    int rows = grid->rows;
    int columns = grid->columns;
    int size = GRID_ELEMENT_SIZE;
    int borderSize = GRID_BORDER_SIZE;
    Image img = new Colori[(rows * size) * (columns * size)];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            NODE_STATE state = grid->get_node_from_position(x, y)->state;
            Colorf col(0.0f);
            switch (state)
            {
            case EMPTY:
                col = EMPTY_COLOR;
                break;
            case BLOCKED:
                col = BLOCKED_COLOR;
                break;
            case ORIGIN:
                col = ORIGIN_COLOR;
                break;
            case TARGET:
                col = TARGET_COLOR;
                break;
            case PATH:
                col = PATH_COLOR;
                break;
            case CHECKED:
#if SHOW_PATH_LIST
                col = CHECK_COLOR;
#else
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
#endif
                break;
            case NEIGHBOUR:
#if SHOW_PATH_NEIGHBOURS
                col = NEIGHBOUR_COLOR;
#else
                col = EMPTY_COLOR;
#endif
                break;
            }
            int startX = x * size;
            int startY = y * size;
            for (int newY = 0; newY < size; newY++)
            {
                for (int newX = 0; newX < size; newX++)
                {
                    int index = (startY + newY) * (columns * size) + (startX + newX);
                    if (newY < borderSize / 2 || newY >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else if (newX < borderSize / 2 || newX >= (size - (borderSize / 2)))
                    {
                        img[index] = get_color(BORDER_COLOR);
                    }
                    else
                    {
                        img[index] = get_color(col);
                    }
                }
            }
        }
    }
    return img;
}